

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.hpp
# Opt level: O3

bool openInput(string *filePath,BamReader *br)

{
  bool bVar1;
  ostream *poVar2;
  string indexPath;
  char local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = BamTools::BamReader::Open(br,filePath);
  if (bVar1) {
    std::operator+(&local_38,filePath,&indexExt_abi_cxx11_);
    bVar1 = BamTools::BamReader::OpenIndex(br,&local_38);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR:BamTools Could not open index ",0x24);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,
                          (char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                           local_38._M_dataplus._M_p._0_1_),
                          local_38._M_string_length);
      local_39 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR:BamTools Could not open ",0x1e);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filePath->_M_dataplus)._M_p,
                        filePath->_M_string_length);
    local_38._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_38,1);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool openInput(const std::string &filePath, BamTools::BamReader &br)
{
    if (!br.Open(filePath))
    {
        std::cerr << "ERROR:BamTools Could not open " << filePath << '\n';
        return false;
    }
    std::string indexPath = filePath + indexExt;
    if (!br.OpenIndex(indexPath))
    {
        std::cerr << "ERROR:BamTools Could not open index " << indexPath << '\n';
        return false;
    }
    return true;
}